

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha2.c
# Opt level: O3

char * SHA384_End(SHA384_CTX *context,char *buffer)

{
  byte bVar1;
  long lVar2;
  long lVar3;
  undefined8 unaff_RBX;
  char *pcVar4;
  sha2_word64 *d;
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  byte local_48 [56];
  
  stack0xfffffffffffffff0 = unaff_RBX;
  if (context != (SHA384_CTX *)0x0) {
    if (buffer == (char *)0x0) {
      auVar6 = ZEXT1664((undefined1  [16])0x0);
      pcVar4 = (char *)0x0;
      auVar5 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])(context->buffer + 0x40) = auVar5;
      auVar5 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])(context->buffer + 0x30) = auVar5;
      auVar5 = vmovdqu64_avx512f(auVar6);
      context->bitcount[0] = auVar5._0_8_;
      context->bitcount[1] = auVar5._8_8_;
      context->buffer[0] = auVar5[0x10];
      context->buffer[1] = auVar5[0x11];
      context->buffer[2] = auVar5[0x12];
      context->buffer[3] = auVar5[0x13];
      context->buffer[4] = auVar5[0x14];
      context->buffer[5] = auVar5[0x15];
      context->buffer[6] = auVar5[0x16];
      context->buffer[7] = auVar5[0x17];
      context->buffer[8] = auVar5[0x18];
      context->buffer[9] = auVar5[0x19];
      context->buffer[10] = auVar5[0x1a];
      context->buffer[0xb] = auVar5[0x1b];
      context->buffer[0xc] = auVar5[0x1c];
      context->buffer[0xd] = auVar5[0x1d];
      context->buffer[0xe] = auVar5[0x1e];
      context->buffer[0xf] = auVar5[0x1f];
      context->buffer[0x10] = auVar5[0x20];
      context->buffer[0x11] = auVar5[0x21];
      context->buffer[0x12] = auVar5[0x22];
      context->buffer[0x13] = auVar5[0x23];
      context->buffer[0x14] = auVar5[0x24];
      context->buffer[0x15] = auVar5[0x25];
      context->buffer[0x16] = auVar5[0x26];
      context->buffer[0x17] = auVar5[0x27];
      context->buffer[0x18] = auVar5[0x28];
      context->buffer[0x19] = auVar5[0x29];
      context->buffer[0x1a] = auVar5[0x2a];
      context->buffer[0x1b] = auVar5[0x2b];
      context->buffer[0x1c] = auVar5[0x2c];
      context->buffer[0x1d] = auVar5[0x2d];
      context->buffer[0x1e] = auVar5[0x2e];
      context->buffer[0x1f] = auVar5[0x2f];
      context->buffer[0x20] = auVar5[0x30];
      context->buffer[0x21] = auVar5[0x31];
      context->buffer[0x22] = auVar5[0x32];
      context->buffer[0x23] = auVar5[0x33];
      context->buffer[0x24] = auVar5[0x34];
      context->buffer[0x25] = auVar5[0x35];
      context->buffer[0x26] = auVar5[0x36];
      context->buffer[0x27] = auVar5[0x37];
      context->buffer[0x28] = auVar5[0x38];
      context->buffer[0x29] = auVar5[0x39];
      context->buffer[0x2a] = auVar5[0x3a];
      context->buffer[0x2b] = auVar5[0x3b];
      context->buffer[0x2c] = auVar5[0x3c];
      context->buffer[0x2d] = auVar5[0x3d];
      context->buffer[0x2e] = auVar5[0x3e];
      context->buffer[0x2f] = auVar5[0x3f];
      auVar5 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])context->state = auVar5;
    }
    else {
      SHA512_Last(context);
      lVar3 = 0;
      lVar2 = 0;
      auVar5 = vmovdqu64_avx512f(*(undefined1 (*) [64])context->state);
      auVar6 = vpshufb_avx512bw(ZEXT4864(auVar5._0_48_),_DAT_0012d440);
      auVar5 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])context->state = auVar5;
      _local_48 = vmovdqu64_avx512f(auVar6);
      auVar6 = ZEXT1664((undefined1  [16])0x0);
      auVar5 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])(context->buffer + 0x40) = auVar5;
      auVar5 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])(context->buffer + 0x30) = auVar5;
      auVar5 = vmovdqu64_avx512f(auVar6);
      context->bitcount[0] = auVar5._0_8_;
      context->bitcount[1] = auVar5._8_8_;
      context->buffer[0] = auVar5[0x10];
      context->buffer[1] = auVar5[0x11];
      context->buffer[2] = auVar5[0x12];
      context->buffer[3] = auVar5[0x13];
      context->buffer[4] = auVar5[0x14];
      context->buffer[5] = auVar5[0x15];
      context->buffer[6] = auVar5[0x16];
      context->buffer[7] = auVar5[0x17];
      context->buffer[8] = auVar5[0x18];
      context->buffer[9] = auVar5[0x19];
      context->buffer[10] = auVar5[0x1a];
      context->buffer[0xb] = auVar5[0x1b];
      context->buffer[0xc] = auVar5[0x1c];
      context->buffer[0xd] = auVar5[0x1d];
      context->buffer[0xe] = auVar5[0x1e];
      context->buffer[0xf] = auVar5[0x1f];
      context->buffer[0x10] = auVar5[0x20];
      context->buffer[0x11] = auVar5[0x21];
      context->buffer[0x12] = auVar5[0x22];
      context->buffer[0x13] = auVar5[0x23];
      context->buffer[0x14] = auVar5[0x24];
      context->buffer[0x15] = auVar5[0x25];
      context->buffer[0x16] = auVar5[0x26];
      context->buffer[0x17] = auVar5[0x27];
      context->buffer[0x18] = auVar5[0x28];
      context->buffer[0x19] = auVar5[0x29];
      context->buffer[0x1a] = auVar5[0x2a];
      context->buffer[0x1b] = auVar5[0x2b];
      context->buffer[0x1c] = auVar5[0x2c];
      context->buffer[0x1d] = auVar5[0x2d];
      context->buffer[0x1e] = auVar5[0x2e];
      context->buffer[0x1f] = auVar5[0x2f];
      context->buffer[0x20] = auVar5[0x30];
      context->buffer[0x21] = auVar5[0x31];
      context->buffer[0x22] = auVar5[0x32];
      context->buffer[0x23] = auVar5[0x33];
      context->buffer[0x24] = auVar5[0x34];
      context->buffer[0x25] = auVar5[0x35];
      context->buffer[0x26] = auVar5[0x36];
      context->buffer[0x27] = auVar5[0x37];
      context->buffer[0x28] = auVar5[0x38];
      context->buffer[0x29] = auVar5[0x39];
      context->buffer[0x2a] = auVar5[0x3a];
      context->buffer[0x2b] = auVar5[0x3b];
      context->buffer[0x2c] = auVar5[0x3c];
      context->buffer[0x2d] = auVar5[0x3d];
      context->buffer[0x2e] = auVar5[0x3e];
      context->buffer[0x2f] = auVar5[0x3f];
      auVar5 = vmovdqu64_avx512f(auVar6);
      *(undefined1 (*) [64])context->state = auVar5;
      do {
        bVar1 = local_48[lVar3];
        lVar2 = lVar2 + -2;
        buffer[lVar3 * 2] = "0123456789abcdef"[bVar1 >> 4];
        buffer[lVar3 * 2 + 1] = "0123456789abcdef"[bVar1 & 0xf];
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x30);
      buffer[0x60] = '\0';
      pcVar4 = buffer + -lVar2;
    }
    return pcVar4;
  }
  __assert_fail("context != (SHA384_CTX*)0",
                "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sha2.c",
                0x404,"char *SHA384_End(SHA384_CTX *, char *)");
}

Assistant:

char *SHA384_End(SHA384_CTX* context, char buffer[SHA384_DIGEST_STRING_LENGTH]) {
	sha2_byte	digest[SHA384_DIGEST_LENGTH], *d = digest;
	int		i;

	/* Sanity check: */
	assert(context != (SHA384_CTX*)0);

	if (buffer != (char*)0) {
		SHA384_Final(digest, context);

		for (i = 0; i < SHA384_DIGEST_LENGTH; i++) {
			*buffer++ = sha2_hex_digits[(*d & 0xf0) >> 4];
			*buffer++ = sha2_hex_digits[*d & 0x0f];
			d++;
		}
		*buffer = (char)0;
	} else {
		MEMSET_BZERO(context, sizeof(SHA384_CTX));
	}
	MEMSET_BZERO(digest, SHA384_DIGEST_LENGTH);
	return buffer;
}